

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileLibraryTargetGenerator::WriteFrameworkRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string extraFlags;
  string linkLanguage;
  string linkRuleVar;
  string local_d8;
  undefined8 local_b8;
  char *local_b0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_d8,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage(&local_a8,this_00,&local_d8);
  paVar1 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)0x6;
  local_d8._M_string_length = 0x6c9982;
  local_d8.field_2._M_allocated_capacity = local_a8._M_string_length;
  local_d8.field_2._8_8_ = local_a8._M_dataplus._M_p;
  local_b8 = 0x18;
  local_b0 = "_CREATE_MACOSX_FRAMEWORK";
  views._M_len = 3;
  views._M_array = (iterator)&local_d8;
  cmCatViews_abi_cxx11_(&local_48,views);
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity =
       local_d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,&local_d8,&local_a8);
  this_01 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS","");
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_68,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)this_01,&local_d8,&local_88,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  WriteLibraryRules(this,&local_48,&local_d8,relink);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteFrameworkRules(bool relink)
{
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_MACOSX_FRAMEWORK");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS", this->GetConfigName());

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}